

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildExtensionRange
          (DescriptorBuilder *this,ExtensionRange *proto,Descriptor *parent,ExtensionRange *result)

{
  int32 iVar1;
  string *psVar2;
  ExtensionRange *result_local;
  Descriptor *parent_local;
  ExtensionRange *proto_local;
  DescriptorBuilder *this_local;
  
  iVar1 = DescriptorProto_ExtensionRange::start(proto);
  result->start = iVar1;
  iVar1 = DescriptorProto_ExtensionRange::end(proto);
  result->end = iVar1;
  if (result->start < 1) {
    psVar2 = Descriptor::full_name_abi_cxx11_(parent);
    AddError(this,psVar2,&proto->super_Message,NUMBER,"Extension numbers must be positive integers."
            );
  }
  if (result->end <= result->start) {
    psVar2 = Descriptor::full_name_abi_cxx11_(parent);
    AddError(this,psVar2,&proto->super_Message,NUMBER,
             "Extension range end number must be greater than start number.");
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildExtensionRange(
    const DescriptorProto::ExtensionRange& proto,
    const Descriptor* parent,
    Descriptor::ExtensionRange* result) {
  result->start = proto.start();
  result->end = proto.end();
  if (result->start <= 0) {
    AddError(parent->full_name(), proto,
             DescriptorPool::ErrorCollector::NUMBER,
             "Extension numbers must be positive integers.");
  }

  // Checking of the upper bound of the extension range is deferred until after
  // options interpreting. This allows messages with message_set_wire_format to
  // have extensions beyond FieldDescriptor::kMaxNumber, since the extension
  // numbers are actually used as int32s in the message_set_wire_format.

  if (result->start >= result->end) {
    AddError(parent->full_name(), proto,
             DescriptorPool::ErrorCollector::NUMBER,
             "Extension range end number must be greater than start number.");
  }
}